

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefTask>
::expand(Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefTask>
         *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  DerefTask *pDVar3;
  undefined8 uVar4;
  DerefTask *pDVar5;
  ulong uVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  size_t sVar9;
  
  sVar9 = 8;
  if (this->_capacity != 0) {
    sVar9 = this->_capacity * 2;
  }
  uVar6 = sVar9 * 0x18;
  if (uVar6 == 0) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar6 < 0x11) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar6 < 0x19) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar6 < 0x21) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar6 < 0x31) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar6 < 0x41) {
    pDVar5 = (DerefTask *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pDVar5 = (DerefTask *)::operator_new(uVar6,0x10);
  }
  if (this->_capacity == 0) {
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pDVar3 = this->_stack;
      *(undefined8 *)((long)&(pDVar5->trm).t._content + lVar7) =
           *(undefined8 *)((long)&(pDVar3->trm).t._content + lVar7);
      puVar1 = (undefined8 *)((long)&(pDVar3->var)._content + lVar7);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pDVar5->var)._content + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      uVar8 = uVar8 + 1;
      uVar6 = this->_capacity;
      lVar7 = lVar7 + 0x18;
    } while (uVar8 < uVar6);
    pDVar3 = this->_stack;
    if (pDVar3 != (DerefTask *)0x0) {
      uVar8 = uVar6 * 0x18 + 0xf & 0xfffffffffffffff0;
      if (uVar8 == 0) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pDVar3;
      }
      else if (uVar8 < 0x11) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pDVar3;
      }
      else if (uVar8 < 0x19) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pDVar3;
      }
      else if (uVar8 < 0x21) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pDVar3;
      }
      else if (uVar8 < 0x31) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar3;
      }
      else if (uVar8 < 0x41) {
        (pDVar3->var)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pDVar3;
      }
      else {
        operator_delete(pDVar3,0x10);
        uVar6 = this->_capacity;
      }
    }
  }
  this->_stack = pDVar5;
  this->_cursor = pDVar5 + uVar6;
  this->_end = pDVar5 + sVar9;
  this->_capacity = sVar9;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }